

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::ConstructSortKeyStruct
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  unsafe_vector<idx_t> *puVar2;
  sel_t *psVar3;
  pointer puVar4;
  data_ptr_t pdVar5;
  unsigned_long uVar6;
  pointer puVar7;
  SortKeyChunk chunk_00;
  idx_t iVar8;
  bool bVar9;
  type pSVar10;
  ulong uVar11;
  ulong row_idx;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true> *child
  ;
  pointer puVar12;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *child_1;
  ulong uVar13;
  undefined7 uStack_37;
  
  puVar2 = info->offsets;
  iVar8 = chunk.start;
  while (uVar11 = iVar8, uVar11 < chunk.end) {
    uVar13 = uVar11;
    if (chunk.has_result_index != false) {
      uVar13 = chunk.result_index;
    }
    psVar3 = ((vector_data->format).sel)->sel_vector;
    row_idx = uVar11;
    if (psVar3 != (sel_t *)0x0) {
      row_idx = (ulong)psVar3[uVar11];
    }
    puVar4 = (puVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = info->result_data[uVar13];
    bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>,
                       row_idx);
    uVar6 = puVar4[uVar13];
    dVar1 = (&vector_data->null_byte)[bVar9];
    puVar4[uVar13] = uVar6 + 1;
    pdVar5[uVar6] = dVar1;
    if (chunk.has_result_index == false) {
      iVar8 = uVar11 + 1;
    }
    else {
      puVar7 = (vector_data->child_data).
               super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = (vector_data->child_data).
                     super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; iVar8 = uVar11 + 1,
          puVar12 != puVar7; puVar12 = puVar12 + 1) {
        pSVar10 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                  ::operator*(puVar12);
        chunk_00._25_7_ = uStack_37;
        chunk_00.has_result_index = true;
        chunk_00.end = uVar11 + 1;
        chunk_00.start = uVar11;
        chunk_00.result_index = uVar13;
        ConstructSortKeyRecursive(pSVar10,chunk_00,info);
      }
    }
  }
  if (chunk.has_result_index == false) {
    puVar7 = (vector_data->child_data).
             super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (vector_data->child_data).
                   super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar7;
        puVar12 = puVar12 + 1) {
      pSVar10 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                ::operator*(puVar12);
      ConstructSortKeyRecursive(pSVar10,chunk,info);
    }
  }
  return;
}

Assistant:

void ConstructSortKeyStruct(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	bool list_of_structs = chunk.has_result_index;
	// write the validity data of the struct
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
		} else {
			// valid value - write the validity byte
			result_ptr[offset++] = vector_data.valid_byte;
		}
		if (list_of_structs) {
			// for a list of structs we need to write the child data for every iteration
			// since the final layout needs to be
			// [struct1][struct2][...]
			for (auto &child : vector_data.child_data) {
				SortKeyChunk child_chunk(r, r + 1, result_index);
				ConstructSortKeyRecursive(*child, child_chunk, info);
			}
		}
	}
	if (!list_of_structs) {
		for (auto &child : vector_data.child_data) {
			ConstructSortKeyRecursive(*child, chunk, info);
		}
	}
}